

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.h
# Opt level: O2

void __thiscall
SortedList<MessageQueue::ListEntry>::InsertAfter
          (SortedList<MessageQueue::ListEntry> *this,DListNode<MessageQueue::ListEntry> *newNode,
          DListNode<MessageQueue::ListEntry> *node)

{
  code *pcVar1;
  PAL_FILE *pPVar2;
  DListNode<MessageQueue::ListEntry> *pDVar3;
  
  pDVar3 = this->head;
  if (pDVar3 == (DListNode<MessageQueue::ListEntry> *)0x0) {
    if (node != (DListNode<MessageQueue::ListEntry> *)0x0) {
      pPVar2 = PAL_get_stderr(0);
      PAL_fprintf(pPVar2,"ASSERTION (%s, line %d) %s %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/MessageQueue.h"
                  ,0x92,"node == nullptr","node == nullptr");
      pPVar2 = PAL_get_stderr(0);
      PAL_fflush(pPVar2);
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  else {
    if (node == (DListNode<MessageQueue::ListEntry> *)0x0) {
      newNode->next = pDVar3;
    }
    else {
      this = (SortedList<MessageQueue::ListEntry> *)&node->next;
      pDVar3 = node->next;
      newNode->next = pDVar3;
      newNode->prev = node;
      if (pDVar3 == (DListNode<MessageQueue::ListEntry> *)0x0) goto LAB_00112eba;
    }
    pDVar3->prev = newNode;
  }
LAB_00112eba:
  *this = (SortedList<MessageQueue::ListEntry>)newNode;
  return;
}

Assistant:

void InsertAfter(DListNode<T>* newNode, DListNode<T>* node)
    {
        // If the list is empty, just set head to newNode
        if (head == nullptr)
        {
            Assert(node == nullptr);
            head = newNode;
            return;
        }

        // If node is null here, we must be trying to insert before head
        if (node == nullptr)
        {
            newNode->next = head;
            head->prev = newNode;
            head = newNode;
            return;
        }

        Assert(node);
        newNode->next = node->next;
        newNode->prev = node;

        if (node->next)
        {
            node->next->prev = newNode;
        }

        node->next = newNode;
    }